

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.cpp
# Opt level: O0

VkShaderStageFlagBits vk::getVkShaderStage(ShaderType shaderType)

{
  VkShaderStageFlagBits *pVVar1;
  ShaderType shaderType_local;
  
  pVVar1 = de::getSizedArrayElement<6,6,vk::VkShaderStageFlagBits>
                     (&getVkShaderStage::s_shaderStages,shaderType);
  return *pVVar1;
}

Assistant:

VkShaderStageFlagBits getVkShaderStage (glu::ShaderType shaderType)
{
	static const VkShaderStageFlagBits s_shaderStages[] =
	{
		VK_SHADER_STAGE_VERTEX_BIT,
		VK_SHADER_STAGE_FRAGMENT_BIT,
		VK_SHADER_STAGE_GEOMETRY_BIT,
		VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
		VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
		VK_SHADER_STAGE_COMPUTE_BIT
	};

	return de::getSizedArrayElement<glu::SHADERTYPE_LAST>(s_shaderStages, shaderType);
}